

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementBackgroundBorder.cpp
# Opt level: O0

void __thiscall Rml::ElementBackgroundBorder::Render(ElementBackgroundBorder *this,Element *element)

{
  Texture texture;
  Vector2f this_00;
  Background *this_01;
  bool bVar1;
  CompiledShader local_e8;
  Texture local_d8;
  Vector2f local_c0;
  Vector2f local_b8;
  Vector2f offset;
  Background *background_1;
  CompiledShader local_98;
  Texture local_88;
  Vector2f local_78;
  Background *local_70;
  Background *shadow;
  reference local_38;
  pair<const_Rml::ElementBackgroundBorder::BackgroundType,_Rml::ElementBackgroundBorder::Background>
  *background;
  iterator __end2;
  iterator __begin2;
  StableMap<BackgroundType,_Background> *__range2;
  Element *element_local;
  ElementBackgroundBorder *this_local;
  
  if (((this->background_dirty & 1U) != 0) || ((this->border_dirty & 1U) != 0)) {
    __end2 = ::std::
             map<Rml::ElementBackgroundBorder::BackgroundType,_Rml::ElementBackgroundBorder::Background,_std::less<Rml::ElementBackgroundBorder::BackgroundType>,_std::allocator<std::pair<const_Rml::ElementBackgroundBorder::BackgroundType,_Rml::ElementBackgroundBorder::Background>_>_>
             ::begin(&this->backgrounds);
    background = (pair<const_Rml::ElementBackgroundBorder::BackgroundType,_Rml::ElementBackgroundBorder::Background>
                  *)::std::
                    map<Rml::ElementBackgroundBorder::BackgroundType,_Rml::ElementBackgroundBorder::Background,_std::less<Rml::ElementBackgroundBorder::BackgroundType>,_std::allocator<std::pair<const_Rml::ElementBackgroundBorder::BackgroundType,_Rml::ElementBackgroundBorder::Background>_>_>
                    ::end(&this->backgrounds);
    while (bVar1 = ::std::operator!=(&__end2,(_Self *)&background), bVar1) {
      local_38 = ::std::
                 _Rb_tree_iterator<std::pair<const_Rml::ElementBackgroundBorder::BackgroundType,_Rml::ElementBackgroundBorder::Background>_>
                 ::operator*(&__end2);
      if (local_38->first != BackgroundBorder) {
        Geometry::Release((Mesh *)&shadow,&(local_38->second).geometry,ReturnMesh);
        Mesh::~Mesh((Mesh *)&shadow);
      }
      ::std::
      _Rb_tree_iterator<std::pair<const_Rml::ElementBackgroundBorder::BackgroundType,_Rml::ElementBackgroundBorder::Background>_>
      ::operator++(&__end2);
    }
    GenerateGeometry(this,element);
    this->background_dirty = false;
    this->border_dirty = false;
  }
  local_70 = GetBackground(this,BoxShadow);
  if ((local_70 == (Background *)0x0) ||
     (bVar1 = UniqueRenderResource::operator_cast_to_bool((UniqueRenderResource *)local_70),
     this_01 = local_70, !bVar1)) {
    offset = (Vector2f)GetBackground(this,BackgroundBorder);
    if (offset != (Vector2f)0x0) {
      local_c0 = Element::GetAbsoluteOffset(element,Border);
      this_00 = offset;
      local_d8.render_manager = (RenderManager *)0x0;
      local_d8.file_index = ~Invalid;
      local_d8.callback_index = ~Invalid;
      local_b8 = local_c0;
      Texture::Texture(&local_d8);
      local_e8.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.render_manager =
           (RenderManager *)0x0;
      local_e8.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.resource_handle =
           0;
      CompiledShader::CompiledShader(&local_e8);
      texture.file_index = local_d8.file_index;
      texture.callback_index = local_d8.callback_index;
      texture.render_manager = local_d8.render_manager;
      Geometry::Render((Geometry *)this_00,local_c0,texture,&local_e8);
      CompiledShader::~CompiledShader(&local_e8);
    }
  }
  else {
    local_78 = Element::GetAbsoluteOffset(element,Border);
    local_88 = CallbackTexture::operator_cast_to_Texture(&local_70->texture);
    local_98.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.render_manager =
         (RenderManager *)0x0;
    local_98.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.resource_handle = 0
    ;
    CompiledShader::CompiledShader(&local_98);
    Geometry::Render(&this_01->geometry,local_78,local_88,&local_98);
    CompiledShader::~CompiledShader(&local_98);
  }
  return;
}

Assistant:

void ElementBackgroundBorder::Render(Element* element)
{
	if (background_dirty || border_dirty)
	{
		for (auto& background : backgrounds)
		{
			if (background.first != BackgroundType::BackgroundBorder)
				background.second.geometry.Release();
		}

		GenerateGeometry(element);

		background_dirty = false;
		border_dirty = false;
	}

	Background* shadow = GetBackground(BackgroundType::BoxShadow);
	if (shadow && shadow->geometry)
		shadow->geometry.Render(element->GetAbsoluteOffset(BoxArea::Border), shadow->texture);
	else if (Background* background = GetBackground(BackgroundType::BackgroundBorder))
	{
		auto offset = element->GetAbsoluteOffset(BoxArea::Border);
		background->geometry.Render(offset);
	}
}